

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3TransferBindings(sqlite3_stmt *pFromStmt,sqlite3_stmt *pToStmt)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  long lVar3;
  long lVar4;
  sqlite3_mutex *psVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  
  if (*(sqlite3_mutex **)(*(long *)pToStmt + 0x18) != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(*(sqlite3_mutex **)(*(long *)pToStmt + 0x18));
  }
  if (0 < *(short *)(pFromStmt + 0x88)) {
    lVar13 = 0;
    lVar12 = 0;
    do {
      lVar3 = *(long *)(pToStmt + 0x78);
      lVar4 = *(long *)(pFromStmt + 0x78);
      sqlite3VdbeMemRelease((Mem *)(lVar13 + lVar3));
      *(undefined8 *)(lVar3 + 0x30 + lVar13) = *(undefined8 *)(lVar4 + 0x30 + lVar13);
      uVar6 = *(undefined8 *)(lVar4 + lVar13);
      uVar7 = ((undefined8 *)(lVar4 + lVar13))[1];
      puVar1 = (undefined8 *)(lVar4 + 0x10 + lVar13);
      uVar8 = *puVar1;
      uVar9 = puVar1[1];
      puVar1 = (undefined8 *)(lVar4 + 0x20 + lVar13);
      uVar10 = puVar1[1];
      puVar2 = (undefined8 *)(lVar3 + 0x20 + lVar13);
      *puVar2 = *puVar1;
      puVar2[1] = uVar10;
      puVar1 = (undefined8 *)(lVar3 + 0x10 + lVar13);
      *puVar1 = uVar8;
      puVar1[1] = uVar9;
      *(undefined8 *)(lVar3 + lVar13) = uVar6;
      ((undefined8 *)(lVar3 + lVar13))[1] = uVar7;
      *(undefined2 *)(lVar4 + 0x24 + lVar13) = 1;
      puVar1 = (undefined8 *)(lVar4 + 0x28 + lVar13);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar12 = lVar12 + 1;
      lVar13 = lVar13 + 0x38;
    } while (lVar12 < *(short *)(pFromStmt + 0x88));
  }
  psVar5 = *(sqlite3_mutex **)(*(long *)pToStmt + 0x18);
  if (psVar5 != (sqlite3_mutex *)0x0) {
    iVar11 = (*sqlite3Config.mutex.xMutexLeave)(psVar5);
    return iVar11;
  }
  return (int)*(long *)pToStmt;
}

Assistant:

SQLITE_PRIVATE int sqlite3TransferBindings(sqlite3_stmt *pFromStmt, sqlite3_stmt *pToStmt){
  Vdbe *pFrom = (Vdbe*)pFromStmt;
  Vdbe *pTo = (Vdbe*)pToStmt;
  int i;
  assert( pTo->db==pFrom->db );
  assert( pTo->nVar==pFrom->nVar );
  sqlite3_mutex_enter(pTo->db->mutex);
  for(i=0; i<pFrom->nVar; i++){
    sqlite3VdbeMemMove(&pTo->aVar[i], &pFrom->aVar[i]);
  }
  sqlite3_mutex_leave(pTo->db->mutex);
  return SQLITE_OK;
}